

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.cpp
# Opt level: O2

void __thiscall Lexico::AnalisadorLexico(Lexico *this)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  uint uVar4;
  uint uVar5;
  uint final;
  ulong uVar6;
  char ch;
  int local_2a4;
  int (*local_2a0) [35];
  string palavra;
  vector<char,_std::allocator<char>_> caracter;
  string local_258;
  ifstream fin;
  
  std::ifstream::ifstream
            (&fin,"/media/augusto/Augusto/Documentos/Codigos/simple-parser/test.txt",_S_in);
  caracter.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  caracter.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  caracter.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  while (plVar3 = (long *)std::istream::get((char *)&fin),
        (*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
    std::vector<char,_std::allocator<char>_>::push_back(&caracter,&ch);
  }
  std::ios::clear((int)&fin + (int)*(undefined8 *)(_fin + -0x18));
  std::ifstream::close();
  palavra._M_dataplus._M_p = (pointer)&palavra.field_2;
  palavra._M_string_length = 0;
  palavra.field_2._M_local_buf[0] = '\0';
  local_2a0 = this->automato;
  final = 0;
  local_2a4 = 0;
  uVar5 = 1;
  do {
    uVar6 = (ulong)local_2a4;
    while( true ) {
      if ((ulong)((long)caracter.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)caracter.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) <= uVar6) {
        Token(this,final);
        Tokens::Inverter(&this->super_Tokens);
        std::__cxx11::string::~string((string *)&palavra);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&caracter.super__Vector_base<char,_std::allocator<char>_>);
        std::ifstream::~ifstream(&fin);
        return;
      }
      iVar2 = PosicaoIndice(this,caracter.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar6]);
      uVar4 = uVar5;
      if (iVar2 == -1) {
        uVar4 = 0;
      }
      if (uVar5 == 1) {
        uVar4 = uVar5;
      }
      if (uVar4 == 1) {
        uVar4 = 0x3c;
      }
      if (iVar2 != -1) {
        uVar4 = local_2a0[(int)uVar5][iVar2];
      }
      if (uVar4 != 0) break;
      if ((final == 0x2c) || (final == 2)) {
        std::__cxx11::string::string((string *)&local_258,(string *)&palavra);
        bVar1 = Tokens::IsReservada(&this->super_Tokens,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        if (!bVar1) {
          Tokens::setToken(&this->super_Tokens,2,(int)palavra._M_string_length);
        }
        palavra._M_string_length = 0;
        *palavra._M_dataplus._M_p = '\0';
        final = 0;
        uVar5 = 1;
      }
      else {
        Token(this,final);
        uVar5 = 1;
        final = 0;
      }
    }
    if (uVar4 == 2) {
      if (1 < uVar4) {
        final = uVar4;
      }
      std::__cxx11::string::push_back((char)&palavra);
      uVar4 = 2;
    }
    else {
      if (1 < uVar4) {
        final = uVar4;
      }
      if (uVar4 == 0x3c) {
        std::operator<<((ostream *)&std::cout,"\nExpected caracter valid!!\n\n");
        exit(0);
      }
    }
    local_2a4 = local_2a4 + 1;
    uVar5 = uVar4;
  } while( true );
}

Assistant:

void Lexico::AnalisadorLexico() {
  ifstream fin ("/media/augusto/Augusto/Documentos/Codigos/simple-parser/test.txt", ifstream::in);
  vector<char> caracter;
  char ch;
  int i, j;

  while (fin.get(ch)) {
    caracter.push_back(ch);
  }

  fin.clear();
  fin.close();
  int current_state = 1;
  int final_state = 0;
  int indice_caracter;
  string palavra;
  i = j = 0;
  while (i < caracter.size()) {
    indice_caracter = PosicaoIndice(caracter[i]);
    // cout << " " << caracter[i] << " | " << current_state << " -> " << indice_caracter << "\n";
    if (indice_caracter == -1 && current_state != 1) current_state = 0;
    if (indice_caracter == -1 && current_state == 1) current_state = estado_erro;
    if (indice_caracter != -1) current_state = automato[current_state][indice_caracter];

    if (isFinal(current_state)) final_state = current_state;

        // cout << caracter[i];
    if (current_state != 0) {
      if (current_state == 2 ) {
       palavra.push_back(caracter[i]);
      }
      i++;
    }
    if (current_state == estado_erro) {
      cout << "\nExpected caracter valid!!\n\n";
      exit(0);
    }
    if (current_state == 0) {
      if (final_state == 2 || final_state == UNDER) {
        // cout << "palavra: " << palavra << "\n";
        if (Tokens::IsReservada(palavra));
        else Tokens::setToken(2, palavra.size());
        palavra.clear();
      }
      else Token(final_state);
      current_state = 1;
      final_state = 0;
    }
  }
  Token (final_state);
  Inverter();
}